

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::OutputCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "uniform mediump float u_special;\nvarying mediump vec2 v_pos;\nvoid main ()\n{\n\tgl_FragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string OutputCase::genFragmentSource (void) const
{
	return
		"uniform mediump float u_special;\n"
		"varying mediump vec2 v_pos;\n"
		"void main ()\n"
		"{\n"
		"	gl_FragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n"
		"}\n";
}